

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

l_mem propagatemark(global_State *g)

{
  lu_byte *plVar1;
  byte *pbVar2;
  uint uVar3;
  GCObject *L;
  TString *pTVar4;
  GCObject *pGVar5;
  long lVar6;
  global_State *pgVar7;
  TValue *pTVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  CallInfo *pCVar12;
  lua_State *th;
  Table *pTVar13;
  long lVar14;
  TValue **__s;
  Table *pTVar15;
  GCObject **ppGVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  
  L = g->gray;
  (L->gch).marked = (L->gch).marked | 4;
  uVar9 = 0;
  switch((L->gch).tt) {
  case '\x05':
    g->gray = (L->h).gclist;
    pGVar5 = (GCObject *)(L->h).metatable;
    if ((pGVar5 != (GCObject *)0x0) && (((pGVar5->gch).marked & 3) != 0)) {
      reallymarkobject(g,pGVar5);
    }
    pTVar15 = (L->h).metatable;
    if ((pTVar15 == (Table *)0x0) || ((pTVar15->flags & 8) != 0)) {
      pTVar8 = (TValue *)0x0;
    }
    else {
      pTVar8 = luaT_gettm(pTVar15,TM_MODE,g->tmname[3]);
    }
    if ((pTVar8 == (TValue *)0x0) || (pTVar8->tt != 4)) {
      bVar18 = false;
      bVar19 = false;
    }
    else {
      __s = &(((pTVar8->value).gc)->h).array;
      pcVar10 = strchr((char *)__s,0x6b);
      bVar18 = pcVar10 != (char *)0x0;
      pcVar11 = strchr((char *)__s,0x76);
      bVar19 = pcVar11 != (char *)0x0;
      if (pcVar10 != (char *)0x0 || pcVar11 != (char *)0x0) {
        (L->gch).marked =
             (pcVar11 != (char *)0x0) << 4 | (pcVar10 != (char *)0x0) << 3 | (L->gch).marked & 0xe7;
        (L->h).gclist = g->weak;
        g->weak = L;
      }
    }
    if ((bool)(bVar18 & bVar19)) {
LAB_00108665:
      (L->gch).marked = (L->gch).marked & 0xfb;
    }
    else {
      if ((!bVar19) && (lVar14 = (long)(L->h).sizearray, lVar14 != 0)) {
        lVar17 = lVar14 * 0x10 + -8;
        do {
          if ((3 < *(int *)((long)&((L->h).array)->value + lVar17)) &&
             (pGVar5 = *(GCObject **)((long)(L->h).array + lVar17 + -8),
             ((pGVar5->gch).marked & 3) != 0)) {
            reallymarkobject(g,pGVar5);
          }
          lVar14 = lVar14 + -1;
          lVar17 = lVar17 + -0x10;
        } while (lVar14 != 0);
      }
      if ((L->h).lsizenode < 0x20) {
        lVar17 = (0x100000000 << ((L->h).lsizenode & 0x3f)) >> 0x20;
        lVar14 = lVar17 * 0x28 + -0x10;
        do {
          pgVar7 = (global_State *)(L->h).node;
          if (*(int *)((long)pgVar7 + lVar14 + -0x10) == 0) {
            if (3 < *(int *)((long)&(pgVar7->strt).hash + lVar14)) {
              *(undefined4 *)((long)&(pgVar7->strt).hash + lVar14) = 0xb;
            }
          }
          else {
            if (((!bVar18) && (3 < *(int *)((long)&(pgVar7->strt).hash + lVar14))) &&
               (pGVar5 = *(GCObject **)((long)pgVar7 + lVar14 + -8), ((pGVar5->gch).marked & 3) != 0
               )) {
              reallymarkobject(g,pGVar5);
            }
            if (((!bVar19) && (3 < *(int *)((long)pgVar7 + lVar14 + -0x10))) &&
               (pGVar5 = *(GCObject **)((long)pgVar7 + lVar14 + -0x18),
               ((pGVar5->gch).marked & 3) != 0)) {
              reallymarkobject(g,pGVar5);
            }
          }
          lVar17 = lVar17 + -1;
          lVar14 = lVar14 + -0x28;
        } while (lVar17 != 0);
      }
      if (bVar18 || bVar19) goto LAB_00108665;
    }
    uVar9 = (long)(L->h).sizearray * 0x10 + (0x28L << ((L->h).lsizenode & 0x3f)) + 0x40;
    break;
  case '\x06':
    g->gray = (GCObject *)(L->h).metatable;
    if (((((GCObject *)(L->h).array)->gch).marked & 3) != 0) {
      reallymarkobject(g,(GCObject *)(L->h).array);
    }
    if ((L->h).flags == '\0') {
      if (((((GCObject *)(L->h).node)->gch).marked & 3) != 0) {
        reallymarkobject(g,(GCObject *)(L->h).node);
      }
      if ((L->h).lsizenode != '\0') {
        uVar9 = 0;
        do {
          pGVar5 = *(GCObject **)((long)L + uVar9 * 8 + 0x28);
          if (((pGVar5->gch).marked & 3) != 0) {
            reallymarkobject(g,pGVar5);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (L->h).lsizenode);
      }
    }
    else if ((L->h).lsizenode != '\0') {
      ppGVar16 = &(L->h).gclist;
      uVar9 = 0;
      do {
        if ((3 < *(int *)ppGVar16) && (((ppGVar16[-1]->gch).marked & 3) != 0)) {
          reallymarkobject(g,ppGVar16[-1]);
        }
        uVar9 = uVar9 + 1;
        ppGVar16 = ppGVar16 + 2;
      } while (uVar9 < (L->h).lsizenode);
    }
    uVar9 = (ulong)(((uint)(L->h).lsizenode << (4U - ((L->h).flags == '\0') & 0x1f)) + 0x28 & 0xfff8
                   );
    break;
  case '\b':
    g->gray = (L->th).gclist;
    (L->th).gclist = g->grayagain;
    g->grayagain = L;
    (L->gch).marked = (L->gch).marked & 0xfb;
    if ((3 < (L->th).l_gt.tt) && (pGVar5 = (L->th).l_gt.value.gc, ((pGVar5->gch).marked & 3) != 0))
    {
      reallymarkobject(g,pGVar5);
    }
    pTVar15 = (L->h).metatable;
    for (pCVar12 = (L->th).base_ci; pCVar12 <= (CallInfo *)(L->h).lastfree; pCVar12 = pCVar12 + 1) {
      if (pTVar15 < (Table *)pCVar12->top) {
        pTVar15 = (Table *)pCVar12->top;
      }
    }
    for (pTVar13 = (Table *)(L->th).stack; pTVar13 < (L->h).metatable;
        pTVar13 = (Table *)&pTVar13->metatable) {
      if ((3 < *(int *)&pTVar13->tt) && (((((Value *)&pTVar13->next)->gc->gch).marked & 3) != 0)) {
        reallymarkobject(g,((Value *)&pTVar13->next)->gc);
      }
    }
    for (; pTVar13 <= pTVar15; pTVar13 = (Table *)&pTVar13->metatable) {
      *(int *)&pTVar13->tt = 0;
    }
    uVar3 = (L->p).sizelocvars;
    if ((int)uVar3 < 0x4e21) {
      pTVar4 = (L->p).source;
      if ((0x10 < (int)uVar3) &&
         ((int)((ulong)((long)(L->h).lastfree - (long)(L->th).base_ci) >> 3) * 0x33333334 <
          (int)uVar3)) {
        luaD_reallocCI(&L->th,uVar3 >> 1);
      }
      uVar3 = (L->p).sizep;
      if (0x5a < (int)uVar3 &&
          (int)((uint)((ulong)((long)pTVar15 - (long)pTVar4) >> 2) & 0xfffffffc) < (int)uVar3) {
        luaD_reallocstack(&L->th,uVar3 >> 1);
      }
    }
    uVar9 = (long)(L->p).sizep * 0x10 + (long)(L->p).sizelocvars * 0x28 + 0xb8;
    break;
  case '\t':
    g->gray = (L->p).gclist;
    if ((L->th).stack != (StkId)0x0) {
      pbVar2 = (byte *)((long)&((L->th).stack)->tt + 1);
      *pbVar2 = *pbVar2 & 0xfc;
    }
    if (0 < (L->p).sizek) {
      lVar17 = 8;
      lVar14 = 0;
      do {
        if ((3 < *(int *)((long)&((L->h).metatable)->next + lVar17)) &&
           (pGVar5 = *(GCObject **)((long)(L->h).metatable + lVar17 + -8),
           ((pGVar5->gch).marked & 3) != 0)) {
          reallymarkobject(g,pGVar5);
        }
        lVar14 = lVar14 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar14 < (L->p).sizek);
    }
    if (0 < (L->p).sizeupvalues) {
      lVar14 = 0;
      do {
        pGVar5 = (&((StkId)(L->p).upvalues)->value)[lVar14].gc;
        if (pGVar5 != (GCObject *)0x0) {
          plVar1 = &(pGVar5->gch).marked;
          *plVar1 = *plVar1 & 0xfc;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (L->p).sizeupvalues);
    }
    if (0 < (L->p).sizep) {
      lVar14 = 0;
      do {
        pGVar5 = (GCObject *)(&(((global_State *)(L->h).node)->strt).hash)[lVar14];
        if ((pGVar5 != (GCObject *)0x0) && (((pGVar5->gch).marked & 3) != 0)) {
          reallymarkobject(g,pGVar5);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (L->p).sizep);
    }
    if (0 < (L->p).sizelocvars) {
      lVar14 = 0;
      lVar17 = 0;
      do {
        lVar6 = *(long *)((long)(L->h).gclist + lVar14);
        if (lVar6 != 0) {
          pbVar2 = (byte *)(lVar6 + 9);
          *pbVar2 = *pbVar2 & 0xfc;
        }
        lVar17 = lVar17 + 1;
        lVar14 = lVar14 + 0x10;
      } while (lVar17 < (L->p).sizelocvars);
    }
    uVar9 = ((long)(L->p).sizelocvars + (long)(L->p).sizek) * 0x10 +
            ((long)(L->p).sizelineinfo + (long)(L->p).sizecode) * 4 +
            ((long)(L->p).sizeupvalues + (long)(L->p).sizep) * 8 + 0x78;
  }
  return uVar9;
}

Assistant:

static l_mem propagatemark(global_State*g){
GCObject*o=g->gray;
gray2black(o);
switch(o->gch.tt){
case 5:{
Table*h=gco2h(o);
g->gray=h->gclist;
if(traversetable(g,h))
black2gray(o);
return sizeof(Table)+sizeof(TValue)*h->sizearray+
sizeof(Node)*sizenode(h);
}
case 6:{
Closure*cl=gco2cl(o);
g->gray=cl->c.gclist;
traverseclosure(g,cl);
return(cl->c.isC)?sizeCclosure(cl->c.nupvalues):
sizeLclosure(cl->l.nupvalues);
}
case 8:{
lua_State*th=gco2th(o);
g->gray=th->gclist;
th->gclist=g->grayagain;
g->grayagain=o;
black2gray(o);
traversestack(g,th);
return sizeof(lua_State)+sizeof(TValue)*th->stacksize+
sizeof(CallInfo)*th->size_ci;
}
case(8+1):{
Proto*p=gco2p(o);
g->gray=p->gclist;
traverseproto(g,p);
return sizeof(Proto)+sizeof(Instruction)*p->sizecode+
sizeof(Proto*)*p->sizep+
sizeof(TValue)*p->sizek+
sizeof(int)*p->sizelineinfo+
sizeof(LocVar)*p->sizelocvars+
sizeof(TString*)*p->sizeupvalues;
}
default:return 0;
}
}